

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

int longseek(FILE *f,int64_t delta,int type)

{
  int iVar1;
  
  iVar1 = fseeko((FILE *)f,delta,type);
  return iVar1;
}

Assistant:

int longseek(FILE *f, int64_t delta, int type)
{
    // todo: lseek64(fileno(f), delta, type);
#if defined(_ANDROID) || defined(ANDROID)
    if (type!=SEEK_CUR) {
        if (delta<0x40000000) {
            return fseek(f, delta, type);
        }
        return fseek(f, 0, type);
    }
    if (delta>0) {
        while (delta>=0x40000000) {
            fseek(f, 0x40000000, SEEK_CUR);
            delta -= 0x40000000;
        }
        return fseek(f, delta, SEEK_CUR);
    }
    else {
        while (delta<=-0x40000000) {
            fseek(f, -0x40000000, SEEK_CUR);
            delta += 0x40000000;
        }
        return fseek(f, delta, SEEK_CUR);
    }
#elif defined(_WIN32)
    return _fseeki64(f, delta, type);
#else
    return fseeko(f, delta, type);
#endif
}